

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O0

void * calloc(size_t __nmemb,size_t __size)

{
  void *pvVar1;
  long *in_FS_OFFSET;
  void *r;
  size_t size_local;
  size_t nitems_local;
  
  if (libc_calloc == (CALLOC_FUNCTION)0x0) {
    if (*(int *)(*in_FS_OFFSET + -4) != 0) {
      pvVar1 = static_calloc(__nmemb * __size);
      return pvVar1;
    }
    printf("wait for smtinit_sem %s %d\n","calloc",0x223);
    malloc_hook();
  }
  pvVar1 = (*libc_calloc)(__nmemb,__size);
  if ((*(int *)(*in_FS_OFFSET + -8) == 0) && (pvVar1 != (void *)0x0)) {
    tr_where('+',pvVar1,__nmemb * __size);
  }
  return pvVar1;
}

Assistant:

void* calloc(size_t nitems, size_t size)
{
    void* r = 0;
    if (!libc_calloc) {
        if (calloc_for_dlsym)
            return static_calloc(nitems*size);
        SMTLOG("wait for smtinit_sem %s %d\n", __FUNCTION__, __LINE__);
        malloc_hook();
    }
    r = libc_calloc(nitems, size);
    if (!use_origin_malloc && r)
        tr_where('+', r, nitems*size);
    return r;
}